

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_1::QueryObjectResetCase::waitForReset
          (QueryObjectResetCase *this,
          SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset)

{
  ContextReset *pCVar1;
  SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset_local;
  QueryObjectResetCase *this_local;
  
  pCVar1 = de::SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset>::operator->(contextReset);
  ContextReset::endQuery(pCVar1);
  pCVar1 = de::SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset>::operator->(contextReset);
  (*pCVar1->_vptr_ContextReset[4])();
  pCVar1 = de::SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset>::operator->(contextReset);
  ContextReset::finish(pCVar1);
  return;
}

Assistant:

virtual void waitForReset (de::SharedPtr<ContextReset>& contextReset)
	{
		contextReset->endQuery();
		contextReset->teardown();
		contextReset->finish();
	}